

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int internalSubset(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  
  if (tok < 0x1a) {
    iVar1 = 0;
    switch(tok) {
    case 0xb:
      return 0x37;
    case 0xc:
    case 0xe:
      break;
    case 0xd:
      return 0x38;
    case 0xf:
      goto switchD_00459599_caseD_f;
    case 0x10:
      iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"ENTITY");
      if (iVar1 != 0) {
        state->handler = entity0;
        return 0xb;
      }
      iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"ATTLIST");
      if (iVar1 != 0) {
        state->handler = attlist0;
        return 0x21;
      }
      iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"ELEMENT");
      if (iVar1 != 0) {
        state->handler = element0;
        return 0x27;
      }
      iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"NOTATION");
      if (iVar1 != 0) {
        state->handler = notation0;
        return 0x11;
      }
      break;
    default:
      if (tok == -4) {
        return 0;
      }
    }
  }
  else {
    if (tok == 0x1a) {
      state->handler = doctype5;
      return 3;
    }
    if (tok == 0x1c) {
      return 0x39;
    }
  }
  state->handler = error;
  iVar1 = -1;
switchD_00459599_caseD_f:
  return iVar1;
}

Assistant:

static int PTRCALL
internalSubset(PROLOG_STATE *state,
               int tok,
               const char *ptr,
               const char *end,
               const ENCODING *enc)
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_DECL_OPEN:
    if (XmlNameMatchesAscii(enc,
                            ptr + 2 * MIN_BYTES_PER_CHAR(enc),
                            end,
                            KW_ENTITY)) {
      state->handler = entity0;
      return XML_ROLE_ENTITY_NONE;
    }
    if (XmlNameMatchesAscii(enc,
                            ptr + 2 * MIN_BYTES_PER_CHAR(enc),
                            end,
                            KW_ATTLIST)) {
      state->handler = attlist0;
      return XML_ROLE_ATTLIST_NONE;
    }
    if (XmlNameMatchesAscii(enc,
                            ptr + 2 * MIN_BYTES_PER_CHAR(enc),
                            end,
                            KW_ELEMENT)) {
      state->handler = element0;
      return XML_ROLE_ELEMENT_NONE;
    }
    if (XmlNameMatchesAscii(enc,
                            ptr + 2 * MIN_BYTES_PER_CHAR(enc),
                            end,
                            KW_NOTATION)) {
      state->handler = notation0;
      return XML_ROLE_NOTATION_NONE;
    }
    break;
  case XML_TOK_PI:
    return XML_ROLE_PI;
  case XML_TOK_COMMENT:
    return XML_ROLE_COMMENT;
  case XML_TOK_PARAM_ENTITY_REF:
    return XML_ROLE_PARAM_ENTITY_REF;
  case XML_TOK_CLOSE_BRACKET:
    state->handler = doctype5;
    return XML_ROLE_DOCTYPE_NONE;
  case XML_TOK_NONE:
    return XML_ROLE_NONE;
  }
  return common(state, tok);
}